

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::TaggedUnionExpression::evalImpl(TaggedUnionExpression *this,EvalContext *context)

{
  bool bVar1;
  PackedUnionType *pPVar2;
  SVInt *pSVar3;
  long in_RSI;
  ConstantValue *in_RDI;
  SVInt *valInt;
  bitwidth_t bits;
  SVInt *resultInt;
  uint32_t tagBits;
  SVUnion u;
  Type *ct;
  FieldSymbol *field;
  ConstantValue initVal;
  ConstantValue *result;
  ConstantValue *in_stack_fffffffffffffe68;
  undefined1 isSigned;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Type *in_stack_fffffffffffffe78;
  bitwidth_t bits_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  SVInt *in_stack_ffffffffffffff10;
  
  slang::ConstantValue::ConstantValue((ConstantValue *)0xa0999f);
  if (*(long *)(in_RSI + 0x38) != 0) {
    Expression::eval((Expression *)in_stack_fffffffffffffe78,
                     (EvalContext *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    slang::ConstantValue::operator=
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa09a01);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa09a0e);
    if (!bVar1) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      goto LAB_00a09dae;
    }
  }
  Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xa09a73);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa09a98);
  Type::getCanonicalType((Type *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  bVar1 = Type::isUnpackedUnion((Type *)0xa09aca);
  if (bVar1) {
    SVUnion::SVUnion((SVUnion *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
              ((optional<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (uint *)in_stack_fffffffffffffe68);
    slang::ConstantValue::operator=
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (SVUnion *)in_stack_fffffffffffffe78);
    SVUnion::~SVUnion((SVUnion *)0xa09b59);
  }
  else {
    pPVar2 = Symbol::as<slang::ast::PackedUnionType>((Symbol *)0xa09b91);
    if (pPVar2->tagBits == 0) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
    }
    else {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa09bf0)
      ;
      isSigned = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
      Type::getDefaultValue(in_stack_fffffffffffffe78);
      bits_00 = (bitwidth_t)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      pSVar3 = slang::ConstantValue::integer((ConstantValue *)0xa09c18);
      SVInt::getBitWidth(pSVar3);
      SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),bits_00,
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),(bool)isSigned);
      SVInt::set(in_stack_ffffffffffffff10,(int32_t)((ulong)in_RSI >> 0x20),(int32_t)in_RSI,
                 (SVInt *)in_RDI);
      SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa09cca);
      if (bVar1) {
        pSVar3 = slang::ConstantValue::integer((ConstantValue *)0xa09cea);
        SVInt::getBitWidth(pSVar3);
        SVInt::set(pSVar3,(int32_t)((ulong)in_RSI >> 0x20),(int32_t)in_RSI,(SVInt *)in_RDI);
      }
    }
  }
LAB_00a09dae:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa09dbb);
  return in_RDI;
}

Assistant:

ConstantValue TaggedUnionExpression::evalImpl(EvalContext& context) const {
    ConstantValue initVal;
    if (valueExpr) {
        initVal = valueExpr->eval(context);
        if (!initVal)
            return nullptr;
    }

    auto& field = member.as<FieldSymbol>();

    auto& ct = type->getCanonicalType();
    if (ct.isUnpackedUnion()) {
        SVUnion u;
        u.activeMember = field.fieldIndex;
        u.value = std::move(initVal);
        return u;
    }
    else {
        uint32_t tagBits = ct.as<PackedUnionType>().tagBits;
        if (tagBits == 0)
            return nullptr;

        ConstantValue result = type->getDefaultValue();
        auto& resultInt = result.integer();

        // The tag lives in the upper bits and the value is in the lower bits.
        // Any bits in between are undefined.
        bitwidth_t bits = resultInt.getBitWidth();
        resultInt.set(int32_t(bits - 1), int32_t(bits - tagBits),
                      SVInt(tagBits, field.fieldIndex, false));

        if (initVal) {
            auto& valInt = initVal.integer();
            resultInt.set(int32_t(valInt.getBitWidth() - 1), 0, valInt);
        }

        return result;
    }
}